

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureFormatTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::TextureBufferFormatCase::TextureBufferFormatCase
          (TextureBufferFormatCase *this,Context *ctx,RenderContext *renderCtx,char *name,
          char *description,deUint32 internalFormat,int width)

{
  TestLog *log;
  ContextType type;
  GLSLVersion glslVersion;
  
  TestCase::TestCase(&this->super_TestCase,ctx,name,description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TextureBufferFormatCase_00a10b08;
  this->m_renderCtx = renderCtx;
  this->m_format = internalFormat;
  this->m_width = width;
  this->m_maxTextureBufferSize = 0;
  this->m_texture = (TextureBuffer *)0x0;
  log = ctx->m_testCtx->m_log;
  type.super_ApiType.m_bits = (ApiType)(*renderCtx->_vptr_RenderContext[2])(renderCtx);
  glslVersion = glu::getContextTypeGLSLVersion(type);
  gls::TextureTestUtil::TextureRenderer::TextureRenderer
            (&this->m_renderer,renderCtx,log,glslVersion,PRECISION_HIGHP);
  return;
}

Assistant:

TextureBufferFormatCase::TextureBufferFormatCase (Context& ctx, glu::RenderContext& renderCtx, const char* name, const char* description, deUint32 internalFormat, int width)
	: TestCase					(ctx, name, description)
	, m_renderCtx				(renderCtx)
	, m_format					(internalFormat)
	, m_width					(width)
	, m_maxTextureBufferSize	(0)
	, m_texture					(DE_NULL)
	, m_renderer				(renderCtx, ctx.getTestContext().getLog(), glu::getContextTypeGLSLVersion(renderCtx.getType()), glu::PRECISION_HIGHP)
{
}